

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

archive_string * archive_strncat(archive_string *as,void *_p,size_t n)

{
  archive_string *paVar1;
  ulong in_RDX;
  archive_string *in_RSI;
  bool bVar2;
  char *pp;
  char *p;
  size_t s;
  uint7 in_stack_ffffffffffffffc8;
  ulong uVar3;
  
  uVar3 = 0;
  paVar1 = in_RSI;
  while( true ) {
    bVar2 = false;
    if (uVar3 < in_RDX) {
      bVar2 = *(char *)&paVar1->s != '\0';
    }
    if (!bVar2) break;
    paVar1 = (archive_string *)((long)&paVar1->s + 1);
    uVar3 = uVar3 + 1;
  }
  paVar1 = archive_string_append(in_RSI,(char *)paVar1,(ulong)in_stack_ffffffffffffffc8);
  if (paVar1 == (archive_string *)0x0) {
    __archive_errx((int)(uVar3 >> 0x20),(char *)in_RSI);
  }
  return paVar1;
}

Assistant:

struct archive_string *
archive_strncat(struct archive_string *as, const void *_p, size_t n)
{
	size_t s;
	const char *p, *pp;

	p = (const char *)_p;

	/* Like strlen(p), except won't examine positions beyond p[n]. */
	s = 0;
	pp = p;
	while (s < n && *pp) {
		pp++;
		s++;
	}
	if ((as = archive_string_append(as, p, s)) == NULL)
		__archive_errx(1, "Out of memory");
	return (as);
}